

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateUnary(OptimizeInstructions *this,Unary *unaryOuter)

{
  bool bVar1;
  Index IVar2;
  Module *pMVar3;
  Unary *unaryInner;
  Unary *unaryOuter_local;
  OptimizeInstructions *this_local;
  
  this_local = (OptimizeInstructions *)Expression::dynCast<wasm::Unary>(unaryOuter->value);
  if ((this_local == (OptimizeInstructions *)0x0) ||
     (*(UnaryOp *)
       &(this_local->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.name != unaryOuter->op)) goto LAB_018e197c;
  switch(*(undefined4 *)
          &(this_local->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.name) {
  case 6:
  case 7:
    this_local = (OptimizeInstructions *)
                 (this_local->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.name._M_string_length;
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    break;
  default:
    goto LAB_018e197c;
  case 0x14:
    IVar2 = Bits::getMaxBits<wasm::OptimizeInstructions>
                      ((Expression *)
                       (this_local->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).super_Pass.name._M_string_length,this);
    if (IVar2 == 1) {
      return (Expression *)
             (this_local->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).super_Pass.name._M_string_length;
    }
LAB_018e197c:
    this_local = (OptimizeInstructions *)0x0;
    break;
  case 0x2f:
  case 0x30:
    pMVar3 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    bVar1 = FeatureSet::hasSignExt(&pMVar3->features);
    if (!bVar1) {
      __assert_fail("getModule()->features.hasSignExt()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x114e,"Expression *wasm::OptimizeInstructions::deduplicateUnary(Unary *)");
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression* deduplicateUnary(Unary* unaryOuter) {
    if (auto* unaryInner = unaryOuter->value->dynCast<Unary>()) {
      if (unaryInner->op == unaryOuter->op) {
        switch (unaryInner->op) {
          case NegFloat32:
          case NegFloat64: {
            // neg(neg(x))  ==>   x
            return unaryInner->value;
          }
          case AbsFloat32:
          case CeilFloat32:
          case FloorFloat32:
          case TruncFloat32:
          case NearestFloat32:
          case AbsFloat64:
          case CeilFloat64:
          case FloorFloat64:
          case TruncFloat64:
          case NearestFloat64: {
            // unaryOp(unaryOp(x))  ==>   unaryOp(x)
            return unaryInner;
          }
          case ExtendS8Int32:
          case ExtendS16Int32: {
            assert(getModule()->features.hasSignExt());
            return unaryInner;
          }
          case EqZInt32: {
            // eqz(eqz(bool(x)))  ==>   bool(x)
            if (Bits::getMaxBits(unaryInner->value, this) == 1) {
              return unaryInner->value;
            }
            break;
          }
          default: {
          }
        }
      }
    }
    return nullptr;
  }